

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
FlowGraph::WalkLoopBlocks(FlowGraph *this,BasicBlock *block,Loop *loop,JitArenaAllocator *tempAlloc)

{
  code *pcVar1;
  FlowEdge **ppFVar2;
  Loop *pLVar3;
  Loop *pLVar4;
  bool bVar5;
  byte bVar6;
  ImplicitCallFlags newFlags;
  uint uVar7;
  undefined4 *puVar8;
  JitArenaAllocator *pJVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar11;
  Type_conflict pSVar12;
  Type *ppFVar13;
  BasicBlock *this_00;
  Loop *local_138;
  BasicBlock *pred;
  FlowEdge **__edge_1;
  Iterator __iter_1;
  BasicBlock *succ;
  FlowEdge **__edge;
  Iterator __iter;
  BOOL isInLoop;
  BasicBlock *lastBlock;
  BasicBlock *tailBlock;
  TrackAllocData local_78;
  BVSparse<Memory::JitArenaAllocator> *local_50;
  BVSparse<Memory::JitArenaAllocator> *loopBlocksBv;
  JitArenaAllocator *tempAlloc_local;
  Loop *loop_local;
  BasicBlock *block_local;
  FlowGraph *this_local;
  bool local_19;
  FlowEdge ***local_18;
  bool local_9;
  
  loopBlocksBv = (BVSparse<Memory::JitArenaAllocator> *)tempAlloc;
  tempAlloc_local = (JitArenaAllocator *)loop;
  loop_local = (Loop *)block;
  block_local = (BasicBlock *)this;
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x553,"(loop)","loop");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pBVar10 = loopBlocksBv;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
             ,0x555);
  pJVar9 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pBVar10,&local_78);
  pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar9,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar10,(JitArenaAllocator *)loopBlocksBv);
  pLVar3 = loop_local;
  local_50 = pBVar10;
  uVar7 = BasicBlock::GetBlockNum((BasicBlock *)loop_local);
  BVSparse<Memory::JitArenaAllocator>::Set(pBVar10,uVar7);
  AddBlockToLoop(this,(BasicBlock *)loop_local,(Loop *)tempAlloc_local);
  if (loop_local !=
      (Loop *)(tempAlloc_local->super_ArenaAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_Allocator.recoverMemoryFunc) {
    do {
      pBVar10 = local_50;
      uVar7 = BasicBlock::GetBlockNum((BasicBlock *)loop_local);
      bVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar10,uVar7);
      __iter.current._4_4_ = (uint)bVar6;
      pSVar11 = &BasicBlock::GetSuccList((BasicBlock *)loop_local)->
                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar11);
      while( true ) {
        local_18 = &__edge;
        if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        ppFVar2 = __edge;
        pSVar12 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar2,
                           pSVar12);
        if (!bVar5) {
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_9 = !bVar5;
        if (!local_9) break;
        ppFVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&__edge);
        __iter_1.current = (NodeBase *)FlowEdge::GetSucc(*ppFVar13);
        if ((BasicBlock *)__iter_1.current == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x566,"(succ)","succ");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if ((*(ushort *)&__iter_1.current[3].next >> 2 & 1) != 0) {
          if ((NodeBase *)
              (tempAlloc_local->super_ArenaAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_Allocator.recoverMemoryFunc == __iter_1.current) {
            __iter.current._4_4_ = 1;
          }
          else if ((__iter_1.current[2].next == (Type)0x0) ||
                  (__iter_1.current[2].next[1].next != __iter_1.current)) {
            if (__iter.current._4_4_ == 0) {
              local_138 = (Loop *)0x0;
            }
            else {
              local_138 = (Loop *)tempAlloc_local;
            }
            BuildLoop(this,(BasicBlock *)__iter_1.current,(BasicBlock *)loop_local,local_138);
          }
        }
      }
      if (__iter.current._4_4_ != 0) {
        pSVar11 = &BasicBlock::GetPredList((BasicBlock *)loop_local)->
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        ___edge_1 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar11);
        while( true ) {
          this_local = (FlowGraph *)&__edge_1;
          if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          ppFVar2 = __edge_1;
          pSVar12 = SListNodeBase<Memory::ArenaAllocator>::Next
                              (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                            ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar2,
                             pSVar12);
          if (!bVar5) {
            SListNodeBase<Memory::ArenaAllocator>::Next
                      (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          }
          local_19 = !bVar5;
          if (!local_19) break;
          ppFVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)&__edge_1);
          this_00 = FlowEdge::GetPred(*ppFVar13);
          if (this_00 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x57a,"(pred)","pred");
            if (!bVar5) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          if ((((this_00->loop != (Loop *)0x0) && (this_00->loop != (Loop *)tempAlloc_local)) &&
              (*(uint *)((tempAlloc_local->super_ArenaAllocator).
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         super_Allocator.recoverMemoryFunc + 0x210) <
               this_00->loop->headBlock->number)) &&
             ((this_00->loop->parent == (Loop *)0x0 ||
              (this_00->loop->parent->headBlock->number <
               *(uint *)((tempAlloc_local->super_ArenaAllocator).
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         super_Allocator.recoverMemoryFunc + 0x210))))) {
            this_00->loop->parent = (Loop *)tempAlloc_local;
            *(ushort *)
             &tempAlloc_local[2].super_ArenaAllocator.
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              needsDelayFreeList =
                 *(ushort *)
                  &tempAlloc_local[2].super_ArenaAllocator.
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   needsDelayFreeList & 0xfeff;
            if ((*(ushort *)&this_00->loop->field_0x178 >> 3 & 1) != 0) {
              Loop::SetHasCall((Loop *)tempAlloc_local);
            }
            if ((*(ushort *)&this_00->loop->field_0x178 >> 4 & 1) != 0) {
              Loop::SetHasYield((Loop *)tempAlloc_local);
            }
            pJVar9 = tempAlloc_local;
            newFlags = Loop::GetImplicitCallFlags(this_00->loop);
            Loop::SetImplicitCallFlags((Loop *)pJVar9,newFlags);
          }
          pBVar10 = local_50;
          uVar7 = BasicBlock::GetBlockNum(this_00);
          BVSparse<Memory::JitArenaAllocator>::Set(pBVar10,uVar7);
        }
        if ((loop_local->topFunc == (Func *)0x0) ||
           (bVar5 = Loop::IsDescendentOrSelf((Loop *)loop_local->topFunc,(Loop *)tempAlloc_local),
           bVar5)) {
          loop_local->topFunc = (Func *)tempAlloc_local;
        }
        if (loop_local != pLVar3) {
          AddBlockToLoop(this,(BasicBlock *)loop_local,(Loop *)tempAlloc_local);
        }
      }
      pLVar4 = loop_local;
      loop_local = (Loop *)BasicBlock::GetPrev((BasicBlock *)loop_local);
    } while (pLVar4 != (Loop *)(tempAlloc_local->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_Allocator.recoverMemoryFunc);
  }
  return;
}

Assistant:

void
FlowGraph::WalkLoopBlocks(BasicBlock *block, Loop *loop, JitArenaAllocator *tempAlloc)
{
    AnalysisAssert(loop);

    BVSparse<JitArenaAllocator> *loopBlocksBv = JitAnew(tempAlloc, BVSparse<JitArenaAllocator>, tempAlloc);
    BasicBlock *tailBlock = block;
    BasicBlock *lastBlock;
    loopBlocksBv->Set(block->GetBlockNum());

    this->AddBlockToLoop(block, loop);

    if (block == loop->headBlock)
    {
        // Single block loop, we're done
        return;
    }

    do
    {
        BOOL isInLoop = loopBlocksBv->Test(block->GetBlockNum());

        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader)
            {
                // Found a loop back-edge
                if (loop->headBlock == succ)
                {
                    isInLoop = true;
                }
                else if (succ->loop == nullptr || succ->loop->headBlock != succ)
                {
                    // Recurse on inner loop
                    BuildLoop(succ, block, isInLoop ? loop : nullptr);
                }
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (isInLoop)
        {
            // This block is in the loop.  All of it's predecessors should be contained in the loop as well.
            FOREACH_PREDECESSOR_BLOCK(pred, block)
            {
                // Fix up loop parent if it isn't set already.
                // If pred->loop != loop, we're looking at an inner loop, which was already visited.
                // If pred->loop->parent == nullptr, this is the first time we see this loop from an outer
                // loop, so this must be an immediate child.
                if (pred->loop && pred->loop != loop && loop->headBlock->number < pred->loop->headBlock->number
                    && (pred->loop->parent == nullptr || pred->loop->parent->headBlock->number < loop->headBlock->number))
                {
                    pred->loop->parent = loop;
                    loop->isLeaf = false;
                    if (pred->loop->hasCall)
                    {
                        loop->SetHasCall();
                    }
                    if (pred->loop->hasYield)
                    {
                        loop->SetHasYield();
                    }
                    loop->SetImplicitCallFlags(pred->loop->GetImplicitCallFlags());
                }
                // Add pred to loop bit vector
                loopBlocksBv->Set(pred->GetBlockNum());
            } NEXT_PREDECESSOR_BLOCK;

            if (block->loop == nullptr || block->loop->IsDescendentOrSelf(loop))
            {
                block->loop = loop;
            }

            if (block != tailBlock)
            {
                this->AddBlockToLoop(block, loop);
            }
        }
        lastBlock = block;
        block = block->GetPrev();
    } while (lastBlock != loop->headBlock);
}